

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock-test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_29a7::ClockTest_GetTimeAndReset_Test::~ClockTest_GetTimeAndReset_Test
          (ClockTest_GetTimeAndReset_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ClockTest, GetTimeAndReset) {
  steady_clock::time_point start;
  steady_clock::time_point t = start;
  double time = GetTimeAndReset(t);
  EXPECT_DOUBLE_EQ(
      std::chrono::duration_cast< duration<double> >(t - start).count(), time);
  EXPECT_GT(t, start);
}